

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

string * __thiscall
t_haxe_generator::function_signature_normal_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_function *tfunction)

{
  bool bVar1;
  uint uVar2;
  t_struct *tstruct;
  t_type *ptVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_91;
  string local_90;
  undefined1 local_60 [8];
  string resulttype;
  string arguments;
  t_function *tfunction_local;
  t_haxe_generator *this_local;
  string *result;
  
  tstruct = t_function::get_arglist(tfunction);
  argument_list_abi_cxx11_((string *)((long)&resulttype.field_2 + 8),this,tstruct);
  std::__cxx11::string::string((string *)local_60);
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    ptVar3 = t_function::get_returntype(tfunction);
    uVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      ptVar3 = t_function::get_returntype(tfunction);
      type_name_abi_cxx11_(&local_90,this,ptVar3,false,false);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_002ee440;
    }
  }
  std::__cxx11::string::operator=((string *)local_60,"Void");
LAB_002ee440:
  local_91 = 0;
  __rhs = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+(&local_118,"function ",__rhs);
  std::operator+(&local_f8,&local_118,"(");
  std::operator+(&local_d8,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&resulttype.field_2 + 8));
  std::operator+(&local_b8,&local_d8,") : ");
  std::operator+(__return_storage_ptr__,&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  local_91 = 1;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(resulttype.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::function_signature_normal(t_function* tfunction) {
  std::string arguments = argument_list(tfunction->get_arglist());

  std::string resulttype;
  if (tfunction->is_oneway() || tfunction->get_returntype()->is_void()) {
    resulttype = "Void";
  } else {
    resulttype = type_name(tfunction->get_returntype());
  }

  std::string result = "function " + tfunction->get_name() + "(" + arguments + ") : " + resulttype;
  return result;
}